

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

Process * asl::Process::execute
                    (Process *__return_storage_ptr__,String *command,Array<asl::String> *args)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  Process *pPVar4;
  long n;
  char buffer [8000];
  int local_1f80 [2];
  char local_1f78 [8008];
  
  Process(__return_storage_ptr__);
  run(__return_storage_ptr__,command,args);
  while (pPVar4 = __return_storage_ptr__, bVar1 = finished(__return_storage_ptr__), !bVar1) {
    sleep((uint)pPVar4);
    if (((__return_storage_ptr__->_ready == true) &&
        (iVar2 = ioctl(__return_storage_ptr__->_stdout,0x541b,local_1f80), iVar2 == 0)) &&
       (0 < local_1f80[0])) {
      iVar2 = 0;
      if (__return_storage_ptr__->_ready == true) {
        sVar3 = read(__return_storage_ptr__->_stdout,local_1f78,8000);
        iVar2 = (int)sVar3;
      }
      String::append(&__return_storage_ptr__->_output,local_1f78,iVar2);
    }
    if (((__return_storage_ptr__->_ready != false) &&
        (iVar2 = ioctl(__return_storage_ptr__->_stderr,0x541b,local_1f80), iVar2 == 0)) &&
       (0 < local_1f80[0])) {
      iVar2 = 0;
      if (__return_storage_ptr__->_ready == true) {
        sVar3 = read(__return_storage_ptr__->_stderr,local_1f78,8000);
        iVar2 = (int)sVar3;
      }
      String::append(&__return_storage_ptr__->_errors,local_1f78,iVar2);
    }
  }
  while( true ) {
    iVar2 = 0;
    if (__return_storage_ptr__->_ready == true) {
      sVar3 = read(__return_storage_ptr__->_stdout,local_1f78,8000);
      iVar2 = (int)sVar3;
    }
    if (iVar2 < 1) break;
    String::append(&__return_storage_ptr__->_output,local_1f78,iVar2);
  }
  while( true ) {
    iVar2 = 0;
    if (__return_storage_ptr__->_ready == true) {
      sVar3 = read(__return_storage_ptr__->_stderr,local_1f78,8000);
      iVar2 = (int)sVar3;
    }
    if (iVar2 < 1) break;
    String::append(&__return_storage_ptr__->_errors,local_1f78,iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Process Process::execute(const String& command, const Array<String>& args)
{
	Process p;
	p.run(command, args);
	int n, i = 0;
	char buffer[8000];
	while (p.running())
	{
		sleep((i++)%16 == 0 ? 0.001 : 0);
		if (p.outputAvailable() > 0)
		{
			n = p.readOutput(buffer, sizeof(buffer));
			p._output.append(buffer, n);
		}
		if (p.errorsAvailable() > 0)
		{
			n = p.readErrors(buffer, sizeof(buffer));
			p._errors.append(buffer, n);
		}
	}
	while (n = p.readOutput(buffer, sizeof(buffer)), n > 0)
		p._output.append(buffer, n);
	while (n = p.readErrors(buffer, sizeof(buffer)), n > 0)
		p._errors.append(buffer, n);
	p._exitstat = p.exitStatus();
	return p;
}